

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

int main(void)

{
  string *this;
  int iVar1;
  ostream *poVar2;
  long lVar3;
  AdsNotificationAttrib attrib;
  AdsNotificationAttrib attrib_1;
  AdsNotification notification;
  AdsDevice route;
  undefined1 local_138 [64];
  undefined6 *local_f8;
  undefined8 uStack_f0;
  undefined6 local_e8;
  undefined2 uStack_e2;
  undefined6 uStack_e0;
  undefined1 local_da;
  undefined1 local_d8 [16];
  undefined1 local_c8 [64];
  unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_> local_88;
  unique_ptr<const_long,_ResourceDeleter<const_long>_> local_58;
  
  if (runExample(std::ostream&)::remoteNetId == '\0') {
    iVar1 = __cxa_guard_acquire(&runExample(std::ostream&)::remoteNetId);
    if (iVar1 != 0) {
      AmsNetId::AmsNetId((AmsNetId *)&runExample(std::ostream&)::remoteNetId,0xc0,0xa8,'\0',0xe7,
                         '\x01','\x01');
      __cxa_guard_release(&runExample(std::ostream&)::remoteNetId);
    }
  }
  local_c8._0_8_ = 0x767265732d736461;
  local_c8._8_2_ = 0x7265;
  local_d8._8_8_ = 10;
  local_c8[10] = 0;
  local_d8._0_8_ = (AdsDevice *)local_c8;
  AdsDevice::AdsDevice
            ((AdsDevice *)&local_88,local_d8,
             CONCAT44(DAT_0010616c,runExample(std::ostream&)::remoteNetId),0x353);
  if ((AdsDevice *)local_d8._0_8_ != (AdsDevice *)local_c8) {
    operator_delete((void *)local_d8._0_8_);
  }
  local_138._0_8_ = (pointer)0x300000001;
  local_138._8_8_ = 0x3d090000000000;
  AdsNotification::AdsNotification
            ((AdsNotification *)local_d8,(AdsDevice *)&local_88,0x4020,4,
             (AdsNotificationAttrib *)local_138,NotifyCallback,0xdeadbeef);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hit ENTER to stop notifications\n",0x20);
  std::istream::ignore();
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)(local_c8 + 0x18));
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)local_d8);
  local_f8 = (undefined6 *)0x300000001;
  uStack_f0._0_4_ = 0;
  uStack_f0._4_4_ = (anon_union_4_2_382c730b_for_AdsNotificationAttrib_3)0x3d0900;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"notificationByNameExample",0x19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"():\n",4);
  local_138._16_6_ = 0x622e4e49414d;
  local_138[0x16] = 'y';
  local_138._23_4_ = 0x65747942;
  local_138[0x1b] = '[';
  local_138._28_2_ = 0x5d34;
  local_138._8_8_ = 0xe;
  local_138[0x1e] = '\0';
  local_138._0_8_ = local_138 + 0x10;
  AdsNotification::AdsNotification
            ((AdsNotification *)local_d8,(AdsDevice *)&local_88,(string *)local_138,
             (AdsNotificationAttrib *)&local_f8,NotifyCallback,0xbeefdead);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hit ENTER to stop by name notifications\n",0x28);
  std::istream::ignore();
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)(local_c8 + 0x18));
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)local_d8);
  local_d8._8_4_ = 0x4020;
  local_d8._0_8_ = (AdsDevice *)&local_88;
  AdsDevice::GetHandle((uint)local_c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"readExample",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"():\n",4);
  lVar3 = 8;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ADS read ",9);
    *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    AdsVariable<unsigned_char>::Read((AdsVariable<unsigned_char> *)local_d8,1,local_138);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_138[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_138,1);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)local_c8);
  local_138._16_6_ = 0x622e4e49414d;
  local_138[0x16] = 'y';
  local_138._23_4_ = 0x65747942;
  local_138[0x1b] = '[';
  local_138._28_2_ = 0x5d34;
  local_138._8_8_ = 0xe;
  local_138[0x1e] = '\0';
  local_d8._8_4_ = 0xf005;
  local_138._0_8_ = local_138 + 0x10;
  local_d8._0_8_ = (AdsDevice *)&local_88;
  AdsDevice::GetHandle((string *)local_c8);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"readByNameExample",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"():\n",4);
  lVar3 = 8;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ADS read ",9);
    *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    AdsVariable<unsigned_char>::Read((AdsVariable<unsigned_char> *)local_d8,1,local_138);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_138[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_138,1);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)local_c8);
  local_138._16_6_ = 0x622e4e49414d;
  local_138[0x16] = 'y';
  local_138._23_4_ = 0x65747942;
  local_138[0x1b] = '[';
  local_138._28_2_ = 0x5d30;
  local_138._8_8_ = 0xe;
  local_138[0x1e] = '\0';
  local_d8._0_8_ = &local_88;
  local_d8._8_4_ = 0xf005;
  local_138._0_8_ = local_138 + 0x10;
  AdsDevice::GetHandle((string *)local_c8);
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_);
  }
  local_e8 = 0x622e4e49414d;
  uStack_e2 = 0x4279;
  uStack_e0 = 0x5d305b657479;
  uStack_f0._0_4_ = 0xe;
  uStack_f0._4_4_ = (anon_union_4_2_382c730b_for_AdsNotificationAttrib_3)0x0;
  local_da = 0;
  this = (string *)(local_138 + 0x10);
  local_138._8_4_ = 0xf005;
  local_138._0_8_ = (AdsDevice *)&local_88;
  local_f8 = &local_e8;
  AdsDevice::GetHandle(this);
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"readWriteExample",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"():\n",4);
  local_f8._0_1_ = 0xa5;
  AdsVariable<unsigned_char>::Write((AdsVariable<unsigned_char> *)local_d8,1,&local_f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wrote ",6);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xa5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," to MAIN.byByte and read ",0x19);
  AdsVariable<unsigned_char>::Read((AdsVariable<unsigned_char> *)local_138,1,&local_f8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," back\n",6);
  local_f8 = (undefined6 *)CONCAT71(local_f8._1_7_,0x5a);
  AdsVariable<unsigned_char>::Write((AdsVariable<unsigned_char> *)local_d8,1,&local_f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wrote ",6);
  AdsVariable<unsigned_char>::Read((AdsVariable<unsigned_char> *)local_d8,1,&local_f8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," to MAIN.byByte and read ",0x19);
  AdsVariable<unsigned_char>::Read((AdsVariable<unsigned_char> *)local_138,1,&local_f8);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," back\n",6);
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)this);
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)local_c8);
  local_138._16_6_ = 0x622e4e49414d;
  local_138[0x16] = 'y';
  local_138._23_4_ = 0x65747942;
  local_138._8_8_ = 0xb;
  local_138[0x1b] = '\0';
  local_d8._8_4_ = 0xf005;
  local_138._0_8_ = this;
  local_d8._0_8_ = (AdsDevice *)&local_88;
  AdsDevice::GetHandle((string *)local_c8);
  if ((string *)local_138._0_8_ != this) {
    operator_delete((void *)local_138._0_8_);
  }
  AdsVariable<std::array<unsigned_char,_4UL>_>::Write
            ((AdsVariable<std::array<unsigned_char,_4UL>_> *)local_d8,4,
             &readWriteArrayExample(std::ostream&,AdsDevice_const&)::arrayToWrite);
  AdsVariable<std::array<unsigned_char,_4UL>_>::Read
            ((AdsVariable<std::array<unsigned_char,_4UL>_> *)local_d8,4,local_138);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Wrote array with first value ",0x1d);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and last value ",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Read back array with first value ",0x21);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," and last value ",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::~unique_ptr
            ((unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_> *)local_c8);
  AdsDevice::GetState();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ADS state: ",0xb);
  *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," devState: ",0xb);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_d8[0] = (ResourceDeleter<unsigned_int>)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_d8,1);
  std::unique_ptr<const_long,_ResourceDeleter<const_long>_>::~unique_ptr(&local_58);
  std::unique_ptr<const_AmsNetId,_ResourceDeleter<const_AmsNetId>_>::~unique_ptr(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hit ENTER to continue\n",0x16);
  std::istream::ignore();
  return 0;
}

Assistant:

int main()
{
    try {
        runExample(std::cout);
    } catch (const AdsException& ex) {
        std::cout << "Error: " << ex.errorCode << "\n";
        std::cout << "AdsException message: " << ex.what() << "\n";
    } catch (const std::runtime_error& ex) {
        std::cout << ex.what() << '\n';
    }
    std::cout << "Hit ENTER to continue\n";
    std::cin.ignore();
}